

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O2

void __thiscall
ModelFlattening_importedUnitsUsingUnitWhichIsAnImportedUnits_Test::TestBody
          (ModelFlattening_importedUnitsUsingUnitWhichIsAnImportedUnits_Test *this)

{
  element_type *peVar1;
  char *pcVar2;
  void *local_130;
  AssertHelper local_128 [8];
  ModelPtr flattenedModel;
  AssertionResult gtest_ar_;
  ImporterPtr importer;
  ModelPtr model;
  ParserPtr parser;
  ModelPtr unitsDefinitionsModel;
  ModelPtr importModel;
  ValidatorPtr validator;
  string modelString;
  string importModelString;
  string e;
  string unitsDefinitionsModelString;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&unitsDefinitionsModelString,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"units_definitions\">\n  <units name=\"more_mm\">\n    <unit prefix=\"milli\" units=\"second\"/>\n  </units>\n</model>"
             ,(allocator<char> *)&importModelString);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&importModelString,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"base\">\n  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"units_definitions.cellml\">\n    <units units_ref=\"more_mm\" name=\"more_mm\"/>\n  </import>\n  <units name=\"mm_sq\">\n    <unit units=\"mm\"/>\n    <unit units=\"more_mm\"/>\n  </units>\n  <units name=\"mm\">\n    <unit prefix=\"milli\" units=\"second\"/>\n  </units>\n  <component name=\"base\">\n    <variable name=\"var1\" units=\"mm_sq\"/>\n  </component>\n</model>"
             ,(allocator<char> *)&modelString);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&modelString,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"multiple_clash\">\n  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"base.cellml\">\n    <component component_ref=\"base\" name=\"base\"/>\n  </import>\n</model>"
             ,(allocator<char> *)&e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"multiple_clash\">\n  <units name=\"mm\">\n    <unit prefix=\"milli\" units=\"metre\"/>\n  </units>\n  <units name=\"mm_sq\">\n    <unit units=\"mm\"/>\n    <unit units=\"mm\"/>\n  </units>\n  <component name=\"base\">\n    <variable name=\"var1\" units=\"mm_sq\"/>\n  </component>\n</model>\n"
             ,(allocator<char> *)&flattenedModel);
  libcellml::Importer::create(SUB81(&importer,0));
  libcellml::Parser::create(SUB81(&parser,0));
  libcellml::Validator::create();
  libcellml::Parser::parseModel((string *)&model);
  libcellml::Parser::parseModel((string *)&importModel);
  libcellml::Parser::parseModel((string *)&unitsDefinitionsModel);
  peVar1 = importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&flattenedModel,"base.cellml",(allocator<char> *)&gtest_ar_);
  libcellml::Importer::addModel((shared_ptr *)peVar1,(string *)&importModel);
  std::__cxx11::string::~string((string *)&flattenedModel);
  peVar1 = importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&flattenedModel,"units_definitions.cellml",(allocator<char> *)&gtest_ar_);
  libcellml::Importer::addModel((shared_ptr *)peVar1,(string *)&unitsDefinitionsModel);
  std::__cxx11::string::~string((string *)&flattenedModel);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&flattenedModel,".",(allocator<char> *)&gtest_ar_);
  libcellml::Importer::resolveImports
            ((shared_ptr *)
             importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (string *)&model);
  std::__cxx11::string::~string((string *)&flattenedModel);
  gtest_ar_.success_ = (bool)libcellml::Model::hasUnresolvedImports();
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_130);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&flattenedModel,&gtest_ar_.success_,
               "model->hasUnresolvedImports()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x6d0,(char *)flattenedModel.
                              super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
    testing::internal::AssertHelper::operator=(local_128,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper(local_128);
    std::__cxx11::string::~string((string *)&flattenedModel);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_130);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  libcellml::Importer::flattenModel((shared_ptr *)&flattenedModel);
  local_130 = (void *)0x0;
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::Model>>
            ((internal *)&gtest_ar_,"nullptr","flattenedModel",&local_130,&flattenedModel);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_130);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x6d3,pcVar2);
    testing::internal::AssertHelper::operator=(local_128,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper(local_128);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_130);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&flattenedModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&unitsDefinitionsModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&importModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&e);
  std::__cxx11::string::~string((string *)&modelString);
  std::__cxx11::string::~string((string *)&importModelString);
  std::__cxx11::string::~string((string *)&unitsDefinitionsModelString);
  return;
}

Assistant:

TEST(ModelFlattening, importedUnitsUsingUnitWhichIsAnImportedUnits)
{
    const std::string unitsDefinitionsModelString =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"units_definitions\">\n"
        "  <units name=\"more_mm\">\n"
        "    <unit prefix=\"milli\" units=\"second\"/>\n"
        "  </units>\n"
        "</model>";
    const std::string importModelString =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"base\">\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"units_definitions.cellml\">\n"
        "    <units units_ref=\"more_mm\" name=\"more_mm\"/>\n"
        "  </import>\n"
        "  <units name=\"mm_sq\">\n"
        "    <unit units=\"mm\"/>\n"
        "    <unit units=\"more_mm\"/>\n"
        "  </units>\n"
        "  <units name=\"mm\">\n"
        "    <unit prefix=\"milli\" units=\"second\"/>\n"
        "  </units>\n"
        "  <component name=\"base\">\n"
        "    <variable name=\"var1\" units=\"mm_sq\"/>\n"
        "  </component>\n"
        "</model>";
    const std::string modelString =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"multiple_clash\">\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"base.cellml\">\n"
        "    <component component_ref=\"base\" name=\"base\"/>\n"
        "  </import>\n"
        "</model>";
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"multiple_clash\">\n"
        "  <units name=\"mm\">\n"
        "    <unit prefix=\"milli\" units=\"metre\"/>\n"
        "  </units>\n"
        "  <units name=\"mm_sq\">\n"
        "    <unit units=\"mm\"/>\n"
        "    <unit units=\"mm\"/>\n"
        "  </units>\n"
        "  <component name=\"base\">\n"
        "    <variable name=\"var1\" units=\"mm_sq\"/>\n"
        "  </component>\n"
        "</model>\n";

    auto importer = libcellml::Importer::create();
    auto parser = libcellml::Parser::create();
    auto validator = libcellml::Validator::create();

    auto model = parser->parseModel(modelString);
    auto importModel = parser->parseModel(importModelString);
    auto unitsDefinitionsModel = parser->parseModel(unitsDefinitionsModelString);

    importer->addModel(importModel, "base.cellml");
    importer->addModel(unitsDefinitionsModel, "units_definitions.cellml");

    importer->resolveImports(model, ".");
    EXPECT_TRUE(model->hasUnresolvedImports());

    auto flattenedModel = importer->flattenModel(model);
    EXPECT_EQ(nullptr, flattenedModel);
}